

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_anyNotEqual_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  bool bVar2;
  int i;
  long lVar3;
  bool bVar4;
  Vector<bool,_3> res_1;
  Vector<bool,_3> res;
  float local_34 [7];
  float local_18 [3];
  undefined8 local_c;
  float local_4;
  
  local_34[0] = c->in[0].m_data[2];
  local_34[1] = c->in[0].m_data[0];
  local_34[2] = c->in[0].m_data[1];
  local_18[2] = 0.0;
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = local_18[lVar3] <= local_34[lVar3] && local_34[lVar3] != local_18[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c = *(undefined8 *)(c->in[1].m_data + 1);
  local_4 = c->in[1].m_data[0];
  local_34[5] = 0.0;
  local_34[3] = 0.0;
  local_34[4] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)&local_c + lVar3 * 4);
    res_1.m_data[lVar3] = local_34[lVar3 + 3] <= fVar1 && fVar1 != local_34[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  bVar4 = false;
  do {
    bVar2 = !bVar4;
    bVar4 = true;
    if (bVar2) {
      bVar4 = res.m_data[lVar3] != res_1.m_data[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (c->color).m_data[0] = (float)bVar4;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }